

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

Config * __thiscall QPDFJob::Config::encryptionFilePassword(Config *this,string *parameter)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  QUtil::make_shared_cstr((QUtil *)&local_28,parameter);
  p_Var3 = p_Stack_20;
  peVar2 = local_28;
  peVar1 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28 = (element_type *)0x0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (peVar1->encryption_file_password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (peVar1->encryption_file_password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  (peVar1->encryption_file_password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::encryptionFilePassword(std::string const& parameter)
{
    o.m->encryption_file_password = QUtil::make_shared_cstr(parameter);
    return this;
}